

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O2

void __thiscall
LINAnalyzerResults::GenerateBubbleText
          (LINAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  string *psVar5;
  Frame frame;
  ulonglong local_1c0;
  long local_1b8;
  byte local_1b0 [8];
  string str [3];
  string fault_str;
  char number_str [128];
  char seq_str [128];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)&frame);
  fault_str._M_dataplus._M_p = (pointer)&fault_str.field_2;
  fault_str._M_string_length = 0;
  fault_str.field_2._M_local_buf[0] = '\0';
  lVar3 = 0x10;
  do {
    puVar4 = (undefined1 *)((long)&str[0]._M_dataplus._M_p + lVar3);
    *(undefined1 **)((long)&local_1b8 + lVar3) = puVar4;
    pbVar1 = local_1b0 + lVar3;
    pbVar1[0] = 0;
    pbVar1[1] = 0;
    pbVar1[2] = 0;
    pbVar1[3] = 0;
    pbVar1[4] = 0;
    pbVar1[5] = 0;
    pbVar1[6] = 0;
    pbVar1[7] = 0;
    *puVar4 = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x70);
  if ((local_1b0[1] & 1) != 0) {
    std::__cxx11::string::append((char *)&fault_str);
  }
  if ((local_1b0[1] & 2) != 0) {
    std::__cxx11::string::append((char *)&fault_str);
  }
  if ((local_1b0[1] & 4) != 0) {
    std::__cxx11::string::append((char *)&fault_str);
  }
  if ((local_1b0[1] & 8) != 0) {
    std::__cxx11::string::append((char *)&fault_str);
  }
  if (fault_str._M_string_length != 0) {
    std::__cxx11::string::append((char *)&fault_str);
    AnalyzerResults::AddResultString
              ((char *)this,fault_str._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    if ((local_1b0[0] != 6) || (local_1b0[1] != 8)) goto LAB_001096bf;
    AnalyzerHelpers::GetNumberString(local_1c0,display_base,8,number_str,0x80);
    std::__cxx11::string::assign((char *)str);
    std::__cxx11::string::append((char *)str);
    psVar5 = str + 1;
    std::__cxx11::string::assign((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    AnalyzerResults::AddResultString
              ((char *)this,str[0]._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    goto LAB_001096a5;
  }
  AnalyzerHelpers::GetNumberString(local_1c0,display_base,8,number_str,0x80);
  switch(local_1b0[0]) {
  case 1:
    std::__cxx11::string::append((char *)str);
    std::__cxx11::string::append((char *)(str + 1));
    break;
  case 2:
    std::__cxx11::string::append((char *)str);
    std::__cxx11::string::append((char *)(str + 1));
    break;
  case 3:
    AnalyzerHelpers::GetNumberString((ulong)((uint)local_1c0 & 0x3f),display_base,8,number_str,0x80)
    ;
    std::__cxx11::string::append((char *)str);
    std::__cxx11::string::append((char *)(str + 1));
    std::__cxx11::string::append((char *)(str + 1));
    std::__cxx11::string::append((char *)(str + 2));
    break;
  case 4:
  case 5:
    AnalyzerHelpers::GetNumberString(local_1b8 - 1,Decimal,8,seq_str,0x80);
    std::__cxx11::string::append((char *)str);
    psVar5 = str + 1;
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    psVar5 = str + 2;
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    goto LAB_00109668;
  case 6:
    std::__cxx11::string::append((char *)str);
    std::__cxx11::string::append((char *)(str + 1));
    std::__cxx11::string::append((char *)(str + 1));
    std::__cxx11::string::append((char *)(str + 2));
    break;
  case 7:
    bVar2 = IsFrameChecksum(this,frame_index);
    if (bVar2) {
      std::__cxx11::string::append((char *)str);
      std::__cxx11::string::append((char *)(str + 1));
      std::__cxx11::string::append((char *)(str + 1));
      std::__cxx11::string::append((char *)(str + 2));
      break;
    }
    AnalyzerHelpers::GetNumberString(local_1b8 - 1,Decimal,8,seq_str,0x80);
    std::__cxx11::string::append((char *)str);
    psVar5 = str + 1;
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    psVar5 = str + 2;
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    std::__cxx11::string::append((char *)psVar5);
    goto LAB_00109668;
  default:
    std::__cxx11::string::append((char *)str);
    std::__cxx11::string::append((char *)(str + 1));
  }
  std::__cxx11::string::append((char *)(str + 2));
LAB_00109668:
  AnalyzerResults::AddResultString
            ((char *)this,str[0]._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  AnalyzerResults::AddResultString
            ((char *)this,str[1]._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  psVar5 = str + 2;
LAB_001096a5:
  AnalyzerResults::AddResultString
            ((char *)this,(psVar5->_M_dataplus)._M_p,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
            );
LAB_001096bf:
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&fault_str);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void LINAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    char number_str[ 128 ];
    std::string fault_str;
    std::string str[ 3 ];

    if( frame.mFlags & byteFramingError )
        fault_str += "!FRAME";
    if( frame.mFlags & headerBreakExpected )
        fault_str += "!BREAK";
    if( frame.mFlags & headerSyncExpected )
        fault_str += "!SYNC";
    if( frame.mFlags & checksumMismatch )
        fault_str += "!CHK";
    if( fault_str.length() )
    {
        fault_str += "!";
        AddResultString( fault_str.c_str() );

        // display the error checksum if and only if the frame was a checksum and the only error was a checksum mismatch.
        if( ( frame.mType == ( U8 )LINAnalyzerResults::responseChecksum ) && ( frame.mFlags == checksumMismatch ) )
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
            str[ 0 ] = "!CHK ERR: ";
            str[ 0 ] += number_str;
            str[ 1 ] = "!Checksum mismatch: ";
            str[ 1 ] += number_str;
            AddResultString( str[ 0 ].c_str() );
            AddResultString( str[ 1 ].c_str() );
        }
    }
    else
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        switch( ( LINAnalyzerResults::tLINFrameState )frame.mType )
        {
        default:
        case LINAnalyzerResults::NoFrame:
            str[ 0 ] += "IBS";
            str[ 1 ] += "IB Space";
            str[ 2 ] += "Inter-Byte Space";
            // AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, str, 128 );
            break;
        case LINAnalyzerResults::headerBreak: // expecting break.
            str[ 0 ] += "BRK";
            str[ 1 ] += "Break";
            str[ 2 ] += "Header Break";
            break;
        case LINAnalyzerResults::headerSync: // expecting sync.
            str[ 0 ] += "SYN";
            str[ 1 ] += "Sync";
            str[ 2 ] += "Header Sync";
            break;
        case LINAnalyzerResults::headerPID: // expecting PID.
            AnalyzerHelpers::GetNumberString( frame.mData1 & 0x3F, display_base, 8, number_str, 128 );
            str[ 0 ] += number_str;

            str[ 1 ] += "PID: ";
            str[ 1 ] += number_str;

            str[ 2 ] += "Protected ID: ";
            str[ 2 ] += number_str;
            break;
        // LIN Response
        case LINAnalyzerResults::responseDataZero: // expecting first resppnse data byte.
        case LINAnalyzerResults::responseData:     // expecting response data.
        {
            char seq_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
            str[ 0 ] += number_str;
            str[ 1 ] += "D";
            str[ 1 ] += seq_str;
            str[ 1 ] += ": ";
            str[ 1 ] += number_str;
            str[ 2 ] += "Data ";
            str[ 2 ] += seq_str;
            str[ 2 ] += ": ";
            str[ 2 ] += number_str;
        }
        break;
        case LINAnalyzerResults::responseChecksum: // expecting checksum.
            str[ 0 ] += number_str;
            str[ 1 ] += "CHK: ";
            str[ 1 ] += number_str;
            str[ 2 ] += "Checksum: ";
            str[ 2 ] += number_str;
            break;

        case LINAnalyzerResults::responsePotentialChecksum:
            if( IsFrameChecksum( frame_index ) )
            {
                str[ 0 ] += number_str;
                str[ 1 ] += "CHK: ";
                str[ 1 ] += number_str;
                str[ 2 ] += "Checksum: ";
                str[ 2 ] += number_str;
            }
            else
            {
                char seq_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
                str[ 0 ] += number_str;
                str[ 1 ] += "D";
                str[ 1 ] += seq_str;
                str[ 1 ] += ": ";
                str[ 1 ] += number_str;
                str[ 2 ] += "Data ";
                str[ 2 ] += seq_str;
                str[ 2 ] += ": ";
                str[ 2 ] += number_str;
            }

            break;
        }

        AddResultString( str[ 0 ].c_str() );
        AddResultString( str[ 1 ].c_str() );
        AddResultString( str[ 2 ].c_str() );
    }
}